

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

btBvhSubtreeInfo * __thiscall
btAlignedObjectArray<btBvhSubtreeInfo>::expand
          (btAlignedObjectArray<btBvhSubtreeInfo> *this,btBvhSubtreeInfo *fillValue)

{
  int iVar1;
  btBvhSubtreeInfo *pbVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  btBvhSubtreeInfo *pbVar5;
  unsigned_short uVar6;
  unsigned_short uVar7;
  unsigned_short uVar8;
  unsigned_short uVar9;
  int iVar10;
  
  iVar1 = this->m_size;
  iVar10 = iVar1;
  if (iVar1 == this->m_capacity) {
    iVar10 = 1;
    if (iVar1 != 0) {
      iVar10 = iVar1 * 2;
    }
    reserve(this,iVar10);
    iVar10 = this->m_size;
  }
  this->m_size = iVar10 + 1;
  pbVar2 = this->m_data;
  uVar6 = fillValue->m_quantizedAabbMin[0];
  uVar7 = fillValue->m_quantizedAabbMin[1];
  uVar8 = fillValue->m_quantizedAabbMin[2];
  uVar9 = fillValue->m_quantizedAabbMax[0];
  uVar3 = *(undefined8 *)(fillValue->m_quantizedAabbMax + 1);
  iVar10 = fillValue->m_padding[0];
  uVar4 = *(undefined8 *)(fillValue->m_padding + 1);
  pbVar5 = pbVar2 + iVar1;
  pbVar5->m_subtreeSize = fillValue->m_subtreeSize;
  pbVar5->m_padding[0] = iVar10;
  *(undefined8 *)(&pbVar5->m_subtreeSize + 2) = uVar4;
  pbVar2 = pbVar2 + iVar1;
  pbVar2->m_quantizedAabbMin[0] = uVar6;
  pbVar2->m_quantizedAabbMin[1] = uVar7;
  pbVar2->m_quantizedAabbMin[2] = uVar8;
  pbVar2->m_quantizedAabbMax[0] = uVar9;
  *(undefined8 *)(pbVar2->m_quantizedAabbMax + 1) = uVar3;
  return this->m_data + iVar1;
}

Assistant:

SIMD_FORCE_INLINE	T&  expand( const T& fillValue=T())
		{	
			const BT_REGISTER int sz = size();
			if( sz == capacity() )
			{
				reserve( allocSize(size()) );
			}
			m_size++;
#ifdef BT_USE_PLACEMENT_NEW
			new (&m_data[sz]) T(fillValue); //use the in-place new (not really allocating heap memory)
#endif

			return m_data[sz];		
		}